

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_loclists.c
# Opt level: O2

int read_single_lle_entry
              (Dwarf_Debug dbg,Dwarf_Small *data,Dwarf_Unsigned dataoffset,Dwarf_Small *enddata,
              Dwarf_Half address_size,uint *bytes_count_out,uint *entry_kind,
              Dwarf_Unsigned *entry_operand1,Dwarf_Unsigned *entry_operand2,
              Dwarf_Unsigned *opsblocksize,Dwarf_Unsigned *opsoffset,Dwarf_Small **ops,
              Dwarf_Error *error)

{
  Dwarf_Small *pDVar1;
  byte bVar2;
  Dwarf_Unsigned DVar3;
  int iVar4;
  char *pcVar5;
  Dwarf_Signed errval;
  ulong uVar6;
  Dwarf_Small *data_00;
  Dwarf_Small *pDVar7;
  ulong uVar8;
  ulong uVar9;
  Dwarf_Unsigned loc_ops_overall_size;
  Dwarf_Unsigned lu_local;
  ulong local_80;
  ulong local_78;
  Dwarf_Unsigned lopsoffset;
  Dwarf_Small *lopsdata;
  Dwarf_Unsigned loc_ops_len;
  Dwarf_Unsigned lu_leblen;
  ulong local_38;
  
  loc_ops_overall_size = 0;
  loc_ops_len = 0;
  lopsdata = (Dwarf_Small *)0x0;
  lopsoffset = 0;
  if (enddata <= data) {
    pcVar5 = 
    "DW_DLE_LOCLISTS_ERROR: An lle entry begins past the end of its allowed space. Corrupt DWARF.";
    goto LAB_00165342;
  }
  bVar2 = *data;
  uVar8 = (ulong)bVar2;
  if (8 < bVar2) {
    if (error != (Dwarf_Error *)0x0) {
      dwarfstring_constructor((dwarfstring_s *)&lu_leblen);
      dwarfstring_append_printf_u
                ((dwarfstring_s *)&lu_leblen,
                 "DW_DLE_LOCLISTS_ERROR: The loclists entry at .debug_loclists offset 0x%x",
                 dataoffset);
      dwarfstring_append_printf_u
                ((dwarfstring_s *)&lu_leblen," has code 0x%x which is unknown",(ulong)(uint)bVar2);
      pcVar5 = dwarfstring_string((dwarfstring_s *)&lu_leblen);
      _dwarf_error_string(dbg,error,0x1d5,pcVar5);
      dwarfstring_destructor((dwarfstring_s *)&lu_leblen);
      return 1;
    }
    return 1;
  }
  data_00 = data + 1;
  switch(uVar8) {
  case 0:
    uVar6 = 1;
    uVar9 = uVar8;
    break;
  case 1:
    lu_leblen = 0;
    lu_local = 0;
    iVar4 = dwarf_decode_leb128((char *)data_00,&lu_leblen,&lu_local,(char *)enddata);
    uVar8 = lu_local;
    DVar3 = lu_leblen;
    if (iVar4 == 1) goto LAB_001655b8;
    goto LAB_001654ea;
  default:
    lu_leblen = 0;
    lu_local = 0;
    iVar4 = dwarf_decode_leb128((char *)data_00,&lu_leblen,&lu_local,(char *)enddata);
    DVar3 = lu_leblen;
    if (iVar4 != 1) {
      local_78 = lu_local;
      lu_leblen = 0;
      lu_local = 0;
      iVar4 = dwarf_decode_leb128((char *)(data_00 + DVar3),&lu_leblen,&lu_local,(char *)enddata);
      if (iVar4 != 1) {
        local_80 = lu_local;
        local_38 = lu_leblen;
        pDVar7 = data_00 + DVar3 + lu_leblen;
        iVar4 = counted_loc_descr(dbg,pDVar7,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                                  &loc_ops_len,&lopsdata,&lopsoffset,error);
        if (iVar4 != 0) {
          return 1;
        }
        uVar6 = loc_ops_overall_size + DVar3 + local_38 + 1;
        goto LAB_001656c5;
      }
    }
    goto LAB_001655b8;
  case 5:
    iVar4 = counted_loc_descr(dbg,data_00,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                              &loc_ops_len,&lopsdata,&lopsoffset,error);
    if (iVar4 != 0) {
      return 1;
    }
    uVar8 = 0;
    DVar3 = loc_ops_overall_size;
LAB_001654ea:
    data_00 = data_00 + DVar3;
    uVar6 = DVar3 + 1;
    uVar9 = 0;
    break;
  case 6:
    lu_leblen = 0;
    uVar8 = (ulong)address_size;
    if (enddata < data_00 + uVar8) {
LAB_0016548d:
      lu_leblen = 0;
      pcVar5 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
      errval = 0x14b;
      goto LAB_0016534a;
    }
    (*dbg->de_copy_word)(&lu_leblen,data_00,uVar8);
    uVar6 = uVar8 + 1;
    data_00 = data_00 + uVar8;
    uVar8 = lu_leblen;
    uVar9 = 0;
    break;
  case 7:
    lu_leblen = 0;
    uVar8 = (ulong)address_size;
    pDVar1 = data_00 + uVar8;
    if (enddata < pDVar1) goto LAB_0016548d;
    (*dbg->de_copy_word)(&lu_leblen,data_00,uVar8);
    DVar3 = lu_leblen;
    lu_leblen = 0;
    pDVar7 = pDVar1 + uVar8;
    if (enddata < pDVar7) {
      pcVar5 = "DW_DLE_READ_LITTLEENDIAN_ERROR Read would end past the end of section";
      errval = 0x14b;
      goto LAB_0016534a;
    }
    local_78 = DVar3;
    (*dbg->de_copy_word)(&lu_leblen,pDVar1,uVar8);
    local_80 = lu_leblen;
    iVar4 = counted_loc_descr(dbg,pDVar7,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                              &loc_ops_len,&lopsdata,&lopsoffset,error);
    if (iVar4 != 0) {
      return 1;
    }
    uVar6 = loc_ops_overall_size + uVar8 * 2 + 1;
LAB_001656c5:
    data_00 = pDVar7 + loc_ops_overall_size;
    uVar8 = local_78;
    uVar9 = local_80;
    break;
  case 8:
    lu_leblen = 0;
    uVar8 = (ulong)address_size;
    pDVar7 = data_00 + uVar8;
    if (enddata < pDVar7) goto LAB_0016548d;
    local_38 = uVar8;
    (*dbg->de_copy_word)(&lu_leblen,data_00,uVar8);
    local_78 = lu_leblen;
    lu_leblen = 0;
    lu_local = 0;
    iVar4 = dwarf_decode_leb128((char *)pDVar7,&lu_leblen,&lu_local,(char *)enddata);
    DVar3 = lu_leblen;
    if (iVar4 != 1) {
      local_80 = lu_local;
      pDVar7 = pDVar7 + lu_leblen;
      iVar4 = counted_loc_descr(dbg,pDVar7,enddata,dataoffset,&loc_ops_overall_size,&lu_leblen,
                                &loc_ops_len,&lopsdata,&lopsoffset,error);
      if (iVar4 != 0) {
        return 1;
      }
      uVar6 = loc_ops_overall_size + local_38 + (DVar3 & 0xffffffff) + 1;
      goto LAB_001656c5;
    }
LAB_001655b8:
    pcVar5 = "DW_DLE_LEB_IMPROPER: decode uleb w/len runs past allowed area.d";
    errval = 0x149;
    goto LAB_0016534a;
  }
  if (enddata < data_00 || data_00 < data) {
    pcVar5 = "DW_DLE_LOCLISTS_ERROR: The end of an lle entry is past the end of its allowed space";
  }
  else {
    if (uVar6 <= (dbg->de_debug_loclists).dss_size) {
      *bytes_count_out = (uint)uVar6;
      *entry_kind = (uint)bVar2;
      *entry_operand1 = uVar8;
      *entry_operand2 = uVar9;
      *opsblocksize = loc_ops_len;
      *opsoffset = lopsoffset;
      *ops = lopsdata;
      return 0;
    }
    pcVar5 = 
    "DW_DLE_LOCLISTS_ERROR: The number of bytes in a single loclist entry is too large to be reasonable"
    ;
  }
LAB_00165342:
  errval = 0x1d5;
LAB_0016534a:
  _dwarf_error_string(dbg,error,errval,pcVar5);
  return 1;
}

Assistant:

static int
read_single_lle_entry(Dwarf_Debug dbg,
    Dwarf_Small    *data,
    Dwarf_Unsigned  dataoffset,
    Dwarf_Small    *enddata,
    Dwarf_Half      address_size,
    unsigned       *bytes_count_out,
    unsigned       *entry_kind,
    Dwarf_Unsigned *entry_operand1,
    Dwarf_Unsigned *entry_operand2,
    Dwarf_Unsigned *opsblocksize, /* Just the  expr data */
    Dwarf_Unsigned *opsoffset, /* Just the expr ops data */
    Dwarf_Small   **ops, /*  pointer to expr ops ops */
    Dwarf_Error* error)
{
    Dwarf_Unsigned count = 0;
    Dwarf_Unsigned leblen = 0;
    unsigned int   code = 0;
    Dwarf_Unsigned val1 = 0;
    Dwarf_Unsigned val2 = 0;
    Dwarf_Unsigned loc_ops_overall_size = 0;
    Dwarf_Unsigned loc_ops_count_len = 0;
    Dwarf_Unsigned loc_ops_len = 0;
    Dwarf_Small   *lopsdata = 0;
    Dwarf_Unsigned lopsoffset = 0;
    Dwarf_Small   *startdata = 0;

    /*  Some of these have a  Counted Location Description
        in them. */
    if (data >= enddata) {
        _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
            "DW_DLE_LOCLISTS_ERROR: "
            "An lle entry begins past the end of "
            "its allowed space. Corrupt DWARF.");
        return DW_DLV_ERROR;
    }
    startdata = data;
    code = *data;
    ++data;
    ++count;
    switch(code) {
    case DW_LLE_end_of_list: break;
    case DW_LLE_base_addressx:{
        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        }
        break;
    case DW_LLE_startx_endx:
    case DW_LLE_startx_length:
    case DW_LLE_offset_pair: {
        int res = 0;

        DECODE_LEB128_UWORD_LEN_CK(data,val1,leblen,
            dbg,error,enddata);
        count += leblen;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data  += loc_ops_overall_size;

        }
        break;
    case DW_LLE_default_location: {
        int res = 0;

        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        data +=  loc_ops_overall_size;
        count +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_base_address: {
        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        }
        break;
    case DW_LLE_start_end: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        READ_UNALIGNED_CK(dbg,val2, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    case DW_LLE_start_length: {
        int res = 0;

        READ_UNALIGNED_CK(dbg,val1, Dwarf_Unsigned,
            data,address_size,error,enddata);
        data += address_size;
        count += address_size;
        DECODE_LEB128_UWORD_LEN_CK(data,val2,leblen,
            dbg,error,enddata);
        count += (unsigned)leblen;
        res = counted_loc_descr(dbg,data,enddata,
            dataoffset,
            &loc_ops_overall_size,
            &loc_ops_count_len,
            &loc_ops_len,
            &lopsdata,
            &lopsoffset,
            error);
        if (res != DW_DLV_OK) {
            return res;
        }
        count += loc_ops_overall_size;
        data +=  loc_ops_overall_size;
        }
        break;
    default: {
        if (error) {
            dwarfstring m;

            dwarfstring_constructor(&m);
            dwarfstring_append_printf_u(&m,
                "DW_DLE_LOCLISTS_ERROR: "
                "The loclists entry at .debug_loclists"
                " offset 0x%x" ,dataoffset);
            dwarfstring_append_printf_u(&m,
                " has code 0x%x which is unknown",code);
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                dwarfstring_string(&m));
            dwarfstring_destructor(&m);
        }
        return DW_DLV_ERROR;
        }
        break;
    }
    {
        /*  We want to avoid overflow in additions, and
            the overall section size is a reasonable check
            on count.  The sequence of tests is to
            preserve a testing baseline:
            baselines/hongg2024-02-18-m.base
            otherwise we would test against sectionsize first.*/
        Dwarf_Unsigned sectionsize = dbg->de_debug_loclists.dss_size;

        if (data > enddata || data < startdata ) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The end of an lle entry is past the end "
                "of its allowed space");
            return DW_DLV_ERROR;
        }
        if (count > sectionsize) {
            /*  Corrupt data being read. */
            _dwarf_error_string(dbg,error,DW_DLE_LOCLISTS_ERROR,
                "DW_DLE_LOCLISTS_ERROR: "
                "The number of bytes in a single "
                "loclist entry is "
                "too large to be reasonable");
            return DW_DLV_ERROR;
        }
    }
    *bytes_count_out = (unsigned)count;
    *entry_kind      = (unsigned)code;
    *entry_operand1  = val1;
    *entry_operand2  = val2;
    *opsblocksize    = loc_ops_len;
    *opsoffset = lopsoffset;
    *ops       = lopsdata;
    return DW_DLV_OK;
}